

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_buffer.c
# Opt level: O3

zip_int64_t read_data(void *state,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  undefined8 uVar1;
  long *plVar2;
  buffer_t *buffer;
  _Bool _Var3;
  int iVar4;
  zip_uint8_t *pzVar5;
  long lVar6;
  zip_int64_t zVar7;
  zip_uint64_t zVar8;
  zip_uint64_t zVar9;
  buffer_t *pbVar10;
  zip_uint64_t *pzVar11;
  zip_buffer_fragment_t *pzVar12;
  int se;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  zip_uint64_t zVar19;
  long lVar20;
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    pbVar10 = *(buffer_t **)((long)state + 0x30);
    goto LAB_0010cc03;
  case ZIP_SOURCE_READ:
    if (-1 < (long)len) {
      plVar2 = *(long **)((long)state + 0x30);
      uVar13 = plVar2[7] - plVar2[8];
      if (len <= uVar13) {
        uVar13 = len;
      }
      if (uVar13 == 0) {
        return 0;
      }
      lVar16 = plVar2[9];
      lVar6 = *plVar2;
      lVar14 = plVar2[8] - *(long *)(plVar2[1] + lVar16 * 8);
      uVar18 = 0;
      do {
        lVar20 = lVar16 * 0x10;
        uVar15 = *(long *)(lVar6 + 8 + lVar20) - lVar14;
        if (uVar13 - uVar18 < uVar15) {
          uVar15 = uVar13 - uVar18;
        }
        memcpy((void *)((long)data + uVar18),(void *)(*(long *)(lVar6 + lVar20) + lVar14),uVar15);
        lVar6 = *plVar2;
        lVar16 = (ulong)(uVar15 == *(long *)(lVar6 + 8 + lVar20) - lVar14) + lVar16;
        uVar18 = uVar15 + uVar18;
        lVar14 = 0;
      } while (uVar18 < uVar13);
      plVar2[8] = plVar2[8] + uVar18;
      plVar2[9] = lVar16;
      return uVar18;
    }
    goto LAB_0010cc19;
  case ZIP_SOURCE_CLOSE:
    break;
  case ZIP_SOURCE_STAT:
    if (0x3f < len) {
      zip_stat_init((zip_stat_t *)data);
      *(undefined8 *)((long)data + 0x28) = *(undefined8 *)((long)state + 0x10);
      uVar1 = *(undefined8 *)(*(long *)((long)state + 0x30) + 0x38);
      *(undefined8 *)((long)data + 0x18) = uVar1;
      *(undefined8 *)((long)data + 0x20) = uVar1;
      *(undefined4 *)((long)data + 0x34) = 0;
      *(undefined8 *)data = 0xdc;
      return 0x40;
    }
    goto LAB_0010cc19;
  case ZIP_SOURCE_ERROR:
    zVar7 = zip_error_to_data((zip_error_t *)state,data,len);
    return zVar7;
  case ZIP_SOURCE_FREE:
    buffer_free(*(buffer_t **)((long)state + 0x30));
    buffer_free(*(buffer_t **)((long)state + 0x38));
    free(state);
    break;
  case ZIP_SOURCE_SEEK:
    pbVar10 = *(buffer_t **)((long)state + 0x30);
    goto LAB_0010cb2e;
  case ZIP_SOURCE_TELL:
    lVar16 = *(long *)((long)state + 0x30);
    goto LAB_0010cb48;
  case ZIP_SOURCE_BEGIN_WRITE:
    pbVar10 = buffer_new((zip_buffer_fragment_t *)0x0,0,0,(zip_error_t *)state);
    *(buffer_t **)((long)state + 0x38) = pbVar10;
    if (pbVar10 == (buffer_t *)0x0) {
      return -1;
    }
LAB_0010cc03:
    pbVar10->offset = 0;
    pbVar10->current_fragment = 0;
    break;
  case ZIP_SOURCE_COMMIT_WRITE:
    buffer_free(*(buffer_t **)((long)state + 0x30));
    *(undefined8 *)((long)state + 0x30) = *(undefined8 *)((long)state + 0x38);
    goto LAB_0010cbe2;
  case ZIP_SOURCE_ROLLBACK_WRITE:
    buffer_free(*(buffer_t **)((long)state + 0x38));
LAB_0010cbe2:
    *(undefined8 *)((long)state + 0x38) = 0;
    break;
  case ZIP_SOURCE_WRITE:
    if (-1 < (long)len) {
      pbVar10 = *(buffer_t **)((long)state + 0x38);
      if (len <= -pbVar10->offset - 0x10000) {
        uVar15 = pbVar10->offset + len;
        pzVar11 = pbVar10->fragment_offsets;
        uVar18 = pbVar10->nfragments;
        uVar13 = pzVar11[uVar18];
        lVar16 = uVar15 - uVar13;
        if (uVar15 < uVar13 || lVar16 == 0) goto LAB_0010ccfa;
        uVar17 = (lVar16 + 0xffffU >> 0x10) + uVar18;
        uVar15 = pbVar10->fragments_capacity;
        if (uVar15 < uVar17) {
          uVar18 = 0x10;
          if (uVar15 != 0) {
            uVar18 = uVar15;
          }
          do {
            uVar15 = uVar18;
            uVar18 = uVar15 * 2;
          } while (uVar15 < uVar17);
          _Var3 = buffer_grow_fragments(pbVar10,uVar15,(zip_error_t *)state);
          if (!_Var3) {
LAB_0010cce9:
            iVar4 = 0xe;
            goto LAB_0010cc21;
          }
          uVar18 = pbVar10->nfragments;
        }
        if (uVar18 < uVar17) {
          pzVar12 = pbVar10->fragments;
          do {
            uVar13 = uVar13 + 0x10000;
            pzVar5 = (zip_uint8_t *)malloc(0x10000);
            pzVar12[uVar18].data = pzVar5;
            if (pzVar5 == (zip_uint8_t *)0x0) goto LAB_0010cce9;
            pzVar12[uVar18].length = 0x10000;
            pbVar10->nfragments = uVar18 + 1;
            pzVar11 = pbVar10->fragment_offsets;
            pzVar11[uVar18 + 1] = uVar13;
            uVar18 = pbVar10->nfragments;
          } while (uVar18 < uVar17);
        }
        else {
          pzVar11 = pbVar10->fragment_offsets;
        }
LAB_0010ccfa:
        zVar8 = pbVar10->offset;
        zVar19 = pbVar10->current_fragment;
        if (len == 0) {
          uVar13 = 0;
        }
        else {
          lVar16 = zVar8 - pzVar11[zVar19];
          pzVar12 = pbVar10->fragments;
          uVar13 = 0;
          do {
            uVar18 = pzVar12[zVar19].length - lVar16;
            if (len - uVar13 < uVar18) {
              uVar18 = len - uVar13;
            }
            memcpy(pzVar12[zVar19].data + lVar16,(void *)((long)data + uVar13),uVar18);
            pzVar12 = pbVar10->fragments;
            zVar19 = (uVar18 == pzVar12[zVar19].length - lVar16) + zVar19;
            uVar13 = uVar18 + uVar13;
            lVar16 = 0;
          } while (uVar13 < len);
          zVar8 = pbVar10->offset;
        }
        uVar18 = zVar8 + uVar13;
        pbVar10->offset = uVar18;
        pbVar10->current_fragment = zVar19;
        if (pbVar10->size < uVar18) {
          pbVar10->size = uVar18;
          return uVar13;
        }
        return uVar13;
      }
    }
    goto LAB_0010cc19;
  case ZIP_SOURCE_SEEK_WRITE:
    pbVar10 = *(buffer_t **)((long)state + 0x38);
LAB_0010cb2e:
    iVar4 = buffer_seek(pbVar10,data,len,(zip_error_t *)state);
    return (long)iVar4;
  case ZIP_SOURCE_TELL_WRITE:
    lVar16 = *(long *)((long)state + 0x38);
LAB_0010cb48:
    if (-1 < *(long *)(lVar16 + 0x40)) {
      return *(long *)(lVar16 + 0x40);
    }
    iVar4 = 0x1e;
    se = 0x4b;
    goto LAB_0010cc23;
  case ZIP_SOURCE_SUPPORTS:
    zVar7 = zip_source_make_command_bitmap
                      (ZIP_SOURCE_GET_FILE_ATTRIBUTES,0,1,2,3,4,5,6,7,8,0x11,9,0xf,10,0xc,0xd,0xb,
                       0xffffffffffffffff);
    return zVar7;
  case ZIP_SOURCE_REMOVE:
    pbVar10 = buffer_new((zip_buffer_fragment_t *)0x0,0,0,(zip_error_t *)state);
    if (pbVar10 == (buffer_t *)0x0) {
      return -1;
    }
    buffer_free(*(buffer_t **)((long)state + 0x30));
    *(buffer_t **)((long)state + 0x30) = pbVar10;
    break;
  default:
    iVar4 = 0x1c;
    goto LAB_0010cc21;
  case ZIP_SOURCE_BEGIN_WRITE_CLONING:
    if (len == 0) {
      pbVar10 = buffer_new((zip_buffer_fragment_t *)0x0,0,1,(zip_error_t *)state);
      *(buffer_t **)((long)state + 0x38) = pbVar10;
      if (pbVar10 == (buffer_t *)0x0) {
        return -1;
      }
      zVar19 = pbVar10->nfragments;
LAB_0010ccdc:
      pbVar10->offset = len;
      pbVar10->current_fragment = zVar19;
      return 0;
    }
    buffer = *(buffer_t **)((long)state + 0x30);
    iVar4 = 0x12;
    if ((len <= buffer->size) && (iVar4 = 0x1d, buffer->shared_buffer == (buffer *)0x0)) {
      zVar8 = buffer_find_fragment(buffer,len);
      pzVar12 = buffer->fragments;
      zVar19 = len - buffer->fragment_offsets[zVar8];
      if (zVar19 == 0) {
        zVar9 = pzVar12[zVar8 - 1].length;
        zVar19 = zVar9;
      }
      else {
        zVar9 = pzVar12[zVar8].length;
        zVar8 = zVar8 + 1;
      }
      iVar4 = 0x1c;
      if (zVar9 - zVar19 <= len) {
        pbVar10 = buffer_new(pzVar12,zVar8,0,(zip_error_t *)state);
        if (pbVar10 != (buffer_t *)0x0) {
          zVar9 = pbVar10->nfragments;
          pbVar10->fragments[zVar9 - 1].length = zVar19;
          pbVar10->fragment_offsets[zVar9] = len;
          pbVar10->size = len;
          zVar19 = pbVar10->nfragments;
          uVar13 = zVar19 - 1;
          if (buffer->first_owned_fragment < zVar19 - 1) {
            uVar13 = buffer->first_owned_fragment;
          }
          pbVar10->first_owned_fragment = uVar13;
          buffer->shared_buffer = pbVar10;
          pbVar10->shared_buffer = buffer;
          buffer->shared_fragments = zVar19;
          pbVar10->shared_fragments = zVar8;
          *(buffer_t **)((long)state + 0x38) = pbVar10;
          goto LAB_0010ccdc;
        }
        goto LAB_0010cdc0;
      }
    }
    zip_error_set((zip_error_t *)state,iVar4,0);
LAB_0010cdc0:
    *(undefined8 *)((long)state + 0x38) = 0;
    return -1;
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    if (0x17 < len) {
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)((long)state + 0x28);
      uVar1 = *(undefined8 *)((long)state + 0x20);
      *(undefined8 *)data = *(undefined8 *)((long)state + 0x18);
      *(undefined8 *)((long)data + 8) = uVar1;
      return 0x18;
    }
LAB_0010cc19:
    iVar4 = 0x12;
LAB_0010cc21:
    se = 0;
LAB_0010cc23:
    zip_error_set((zip_error_t *)state,iVar4,se);
    return -1;
  }
  return 0;
}

Assistant:

static zip_int64_t
read_data(void *state, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct read_data *ctx = (struct read_data *)state;

    switch (cmd) {
    case ZIP_SOURCE_BEGIN_WRITE:
	if ((ctx->out = buffer_new(NULL, 0, 0, &ctx->error)) == NULL) {
	    return -1;
	}
	ctx->out->offset = 0;
	ctx->out->current_fragment = 0;
	return 0;

    case ZIP_SOURCE_BEGIN_WRITE_CLONING:
	if ((ctx->out = buffer_clone(ctx->in, len, &ctx->error)) == NULL) {
	    return -1;
	}
	ctx->out->offset = len;
	ctx->out->current_fragment = ctx->out->nfragments;
	return 0;

    case ZIP_SOURCE_CLOSE:
	return 0;

    case ZIP_SOURCE_COMMIT_WRITE:
	buffer_free(ctx->in);
	ctx->in = ctx->out;
	ctx->out = NULL;
	return 0;

    case ZIP_SOURCE_ERROR:
	return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
	buffer_free(ctx->in);
	buffer_free(ctx->out);
	free(ctx);
	return 0;

    case ZIP_SOURCE_GET_FILE_ATTRIBUTES: {
	if (len < sizeof(ctx->attributes)) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}

	memcpy(data, &ctx->attributes, sizeof(ctx->attributes));

	return sizeof(ctx->attributes);
    }

    case ZIP_SOURCE_OPEN:
	ctx->in->offset = 0;
	ctx->in->current_fragment = 0;
	return 0;

    case ZIP_SOURCE_READ:
	if (len > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}
	return buffer_read(ctx->in, data, len);

    case ZIP_SOURCE_REMOVE: {
	buffer_t *empty = buffer_new(NULL, 0, 0, &ctx->error);
	if (empty == NULL) {
	    return -1;
	}

	buffer_free(ctx->in);
	ctx->in = empty;
	return 0;
    }

    case ZIP_SOURCE_ROLLBACK_WRITE:
	buffer_free(ctx->out);
	ctx->out = NULL;
	return 0;

    case ZIP_SOURCE_SEEK:
	return buffer_seek(ctx->in, data, len, &ctx->error);

    case ZIP_SOURCE_SEEK_WRITE:
	return buffer_seek(ctx->out, data, len, &ctx->error);

    case ZIP_SOURCE_STAT: {
	zip_stat_t *st;

	if (len < sizeof(*st)) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}

	st = (zip_stat_t *)data;

	zip_stat_init(st);
	st->mtime = ctx->mtime;
	st->size = ctx->in->size;
	st->comp_size = st->size;
	st->comp_method = ZIP_CM_STORE;
	st->encryption_method = ZIP_EM_NONE;
	st->valid = ZIP_STAT_MTIME | ZIP_STAT_SIZE | ZIP_STAT_COMP_SIZE | ZIP_STAT_COMP_METHOD | ZIP_STAT_ENCRYPTION_METHOD;

	return sizeof(*st);
    }

    case ZIP_SOURCE_SUPPORTS:
	return zip_source_make_command_bitmap(ZIP_SOURCE_GET_FILE_ATTRIBUTES, ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, ZIP_SOURCE_SEEK, ZIP_SOURCE_TELL, ZIP_SOURCE_BEGIN_WRITE, ZIP_SOURCE_BEGIN_WRITE_CLONING, ZIP_SOURCE_COMMIT_WRITE, ZIP_SOURCE_REMOVE, ZIP_SOURCE_ROLLBACK_WRITE, ZIP_SOURCE_SEEK_WRITE, ZIP_SOURCE_TELL_WRITE, ZIP_SOURCE_WRITE, -1);

    case ZIP_SOURCE_TELL:
	if (ctx->in->offset > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_TELL, EOVERFLOW);
	    return -1;
	}
	return (zip_int64_t)ctx->in->offset;


    case ZIP_SOURCE_TELL_WRITE:
	if (ctx->out->offset > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_TELL, EOVERFLOW);
	    return -1;
	}
	return (zip_int64_t)ctx->out->offset;

    case ZIP_SOURCE_WRITE:
	if (len > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}
	return buffer_write(ctx->out, data, len, &ctx->error);

    default:
	zip_error_set(&ctx->error, ZIP_ER_OPNOTSUPP, 0);
	return -1;
    }
}